

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl::paste(Fl_Widget *receiver,int clipboard,char *type)

{
  Display *pDVar1;
  Atom AVar2;
  Fl_Window *w;
  Window WVar3;
  Atom local_30;
  Atom property;
  char *type_local;
  int clipboard_local;
  Fl_Widget *receiver_local;
  
  AVar2 = TARGETS;
  pDVar1 = fl_display;
  if (fl_i_own_selection[clipboard] == '\0') {
    if (clipboard == 0) {
      local_30 = 1;
    }
    else {
      local_30 = CLIPBOARD;
    }
    e_clipboard_type = type;
    fl_selection_requestor = receiver;
    w = first_window();
    WVar3 = fl_xid(w);
    XConvertSelection(pDVar1,local_30,AVar2,local_30,WVar3,fl_event_time);
  }
  else if (fl_selection_type[clipboard] == "text/plain") {
    e_text = fl_selection_buffer[clipboard];
    e_length = fl_selection_length[clipboard];
    if (e_text == (char *)0x0) {
      e_text = "";
    }
    (*receiver->_vptr_Fl_Widget[3])(receiver,0x11);
  }
  return;
}

Assistant:

void Fl::paste(Fl_Widget &receiver, int clipboard, const char *type) {
  if (fl_i_own_selection[clipboard]) {
    // We already have it, do it quickly without window server.
    // Notice that the text is clobbered if set_selection is
    // called in response to FL_PASTE!
    // However, for now, we only paste text in this function
    if (fl_selection_type[clipboard] != Fl::clipboard_plain_text) return; //TODO: allow copy/paste of image within same app
    Fl::e_text = fl_selection_buffer[clipboard];
    Fl::e_length = fl_selection_length[clipboard];
    if (!Fl::e_text) Fl::e_text = (char *)"";
    receiver.handle(FL_PASTE);
    return;
  }
  // otherwise get the window server to return it:
  fl_selection_requestor = &receiver;
  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  Fl::e_clipboard_type = type;
  XConvertSelection(fl_display, property, TARGETS, property,
                    fl_xid(Fl::first_window()), fl_event_time);
}